

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O3

void __thiscall
diy::AMRLink::AMRLink(AMRLink *this,int dim,int level,Point *refinement,Bounds *core,Bounds *bounds)

{
  allocator<int> local_161;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_160;
  Bounds local_120;
  Bounds local_a0;
  
  (this->super_Registrar<diy::AMRLink>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_Registrar<diy::AMRLink>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_Registrar<diy::AMRLink>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_Registrar<diy::AMRLink>).super_Link.super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__0014e758;
  this->dim_ = dim;
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&local_160,&refinement->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,
             &local_161);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&local_a0,
             (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)core,&local_161);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,
             &(core->max).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,&local_161);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&local_120,
             (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)bounds,&local_161);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&local_120.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,
             &(bounds->max).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,&local_161);
  Description::Description(&this->local_,level,(Point *)&local_160,&local_a0,&local_120);
  local_120.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_120.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_120.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_120.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_120.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_120.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_120.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_120.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_120.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_120.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_160.m_end = local_160.m_begin;
  if (local_160.m_dynamic_data != (pointer)0x0) {
    operator_delete(local_160.m_dynamic_data,local_160.m_dynamic_capacity << 2);
  }
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nbr_descriptions_).
  super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nbr_descriptions_).
  super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nbr_descriptions_).
  super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

AMRLink(int dim, int level, Point refinement, const Bounds& core, const Bounds& bounds):
                        dim_(dim), local_ { level, refinement, core, bounds }               {}